

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void __thiscall
kratos::DeadCodeInstanceElimination::visit(DeadCodeInstanceElimination *this,Generator *generator)

{
  shared_ptr<kratos::Generator> *psVar1;
  shared_ptr<kratos::Generator> *child;
  pointer __args;
  undefined1 child_00 [8];
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  local_60;
  undefined1 auStack_48 [8];
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  remove_set;
  
  Generator::get_child_generators(&local_60,generator);
  auStack_48 = (undefined1  [8])0x0;
  remove_set.
  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  remove_set.
  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  child_00 = auStack_48;
  psVar1 = remove_set.
           super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_60.
      super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __args = local_60.
             super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((((__args->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          ports_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::
        vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>
        ::emplace_back<std::shared_ptr<kratos::Generator>const&>
                  ((vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>
                    *)auStack_48,__args);
      }
      __args = __args + 1;
      child_00 = auStack_48;
      psVar1 = remove_set.
               super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (__args != local_60.
                       super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  for (; child_00 != (undefined1  [8])psVar1; child_00 = (undefined1  [8])((long)child_00 + 0x10)) {
    Generator::remove_child_generator(generator,(shared_ptr<kratos::Generator> *)child_00);
  }
  std::
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           *)auStack_48);
  std::
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>::
  ~vector(&local_60);
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto const& children = generator->get_child_generators();
        std::vector<std::shared_ptr<Generator>> remove_set;
        for (auto const& child : children) {
            if (child->get_port_names().empty()) {
                remove_set.emplace_back(child);
            }
        }
        for (auto const& child : remove_set) {
            generator->remove_child_generator(child);
        }
    }